

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZParFrontStructMatrix.cpp
# Opt level: O1

int __thiscall
TPZParFrontStructMatrix<TPZFrontSym<double>,_double,_TPZStructMatrixTBBFlow<double>_>::ClassId
          (TPZParFrontStructMatrix<TPZFrontSym<double>,_double,_TPZStructMatrixTBBFlow<double>_>
           *this)

{
  uint uVar1;
  int iVar2;
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"TPZParFrontStructMatrix","");
  uVar1 = Hash(&local_40);
  iVar2 = TPZFrontStructMatrix<TPZFrontSym<double>,_double,_TPZStructMatrixTBBFlow<double>_>::
          ClassId(&this->
                   super_TPZFrontStructMatrix<TPZFrontSym<double>,_double,_TPZStructMatrixTBBFlow<double>_>
                 );
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return iVar2 * 2 ^ uVar1;
}

Assistant:

int TPZParFrontStructMatrix<TFront,TVar,TPar>::ClassId() const{
    return Hash("TPZParFrontStructMatrix") ^
        TPZFrontStructMatrix<TFront,TVar,TPar>::ClassId()<<1;
}